

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O0

int rtmidi_get_compiled_api(RtMidiApi *apis,uint apis_size)

{
  uint local_1c;
  uint local_18;
  uint num;
  uint apis_size_local;
  RtMidiApi *apis_local;
  
  local_18 = 1;
  if (apis != (RtMidiApi *)0x0) {
    local_1c = apis_size;
    if (1 < apis_size) {
      local_1c = 1;
    }
    local_18 = local_1c;
    memcpy(apis,rtmidi_compiled_apis,(ulong)local_1c << 2);
  }
  return local_18;
}

Assistant:

int rtmidi_get_compiled_api (enum RtMidiApi *apis, unsigned int apis_size)
{
    unsigned num = rtmidi_num_compiled_apis;
    if (apis) {
        num = (num < apis_size) ? num : apis_size;
        memcpy(apis, rtmidi_compiled_apis, num * sizeof(enum RtMidiApi));
    }
    return (int)num;
}